

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::emit_wave_active_bit_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *this;
  bool bVar1;
  Id arg;
  Operation *this_00;
  Value *value;
  Id local_3c;
  Id input_value;
  Operation *op;
  uint32_t op_kind;
  Op opcode;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  _op_kind = Converter::Impl::builder(impl);
  op._4_4_ = OpNop;
  bVar1 = get_constant_operand((Instruction *)builder,2,(uint32_t *)&op);
  if (bVar1) {
    if ((WaveBitOpKind)op == And) {
      op._4_4_ = OpGroupNonUniformBitwiseAnd;
    }
    else if ((WaveBitOpKind)op == Or) {
      op._4_4_ = OpGroupNonUniformBitwiseOr;
    }
    else if ((WaveBitOpKind)op == Xor) {
      op._4_4_ = OpGroupNonUniformBitwiseXor;
    }
    this_00 = Converter::Impl::allocate((Impl *)instruction_local,op._4_4_,(Value *)builder);
    arg = spv::Builder::makeUintConstant(_op_kind,3,false);
    Operation::add_id(this_00,arg);
    Operation::add_literal(this_00,0);
    this = instruction_local;
    value = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    local_3c = Converter::Impl::get_id_for_value((Impl *)this,value,0);
    bVar1 = wave_op_needs_helper_lane_masking((Impl *)instruction_local);
    if (bVar1) {
      local_3c = build_mask_reduction_input_bitwise
                           ((Impl *)instruction_local,(CallInst *)builder,local_3c,(WaveBitOpKind)op
                           );
    }
    Operation::add_id(this_00,local_3c);
    Converter::Impl::add((Impl *)instruction_local,this_00,false);
    spv::Builder::addCapability(_op_kind,CapabilityGroupNonUniformArithmetic);
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_wave_active_bit_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	spv::Op opcode = spv::OpNop;

	uint32_t op_kind;
	if (!get_constant_operand(instruction, 2, &op_kind))
		return false;

	switch (static_cast<DXIL::WaveBitOpKind>(op_kind))
	{
	case DXIL::WaveBitOpKind::And:
		opcode = spv::OpGroupNonUniformBitwiseAnd;
		break;

	case DXIL::WaveBitOpKind::Or:
		opcode = spv::OpGroupNonUniformBitwiseOr;
		break;

	case DXIL::WaveBitOpKind::Xor:
		opcode = spv::OpGroupNonUniformBitwiseXor;
		break;
	}

	auto *op = impl.allocate(opcode, instruction);
	op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	op->add_literal(spv::GroupOperationReduce);

	spv::Id input_value = impl.get_id_for_value(instruction->getOperand(1));
	if (wave_op_needs_helper_lane_masking(impl))
		input_value = build_mask_reduction_input_bitwise(impl, instruction, input_value, DXIL::WaveBitOpKind(op_kind));

	op->add_id(input_value);

	impl.add(op);

	builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
	return true;
}